

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O3

void PatternGridHeaderTU::drawPlus(QPainter *painter,int xpos,QColor *color)

{
  QColor local_38;
  
  local_38.cspec = xpos + ExtendedRgb;
  local_38.ct._0_4_ = 0xc;
  local_38.ct._4_4_ = xpos + 6;
  local_38._12_4_ = 0x13;
  QPainter::fillRect((QRect *)painter,&local_38);
  local_38.ct._0_4_ = 0xf;
  local_38.ct._4_4_ = xpos + 9;
  local_38._12_4_ = 0x10;
  local_38.cspec = xpos + Hsv;
  QPainter::fillRect((QRect *)painter,&local_38);
  return;
}

Assistant:

void drawPlus(QPainter &painter, int xpos, QColor const& color) {
    // vertical
    painter.fillRect(
        xpos + PM_VPAD + PM_CENTER,
        PLUS_START_Y + PM_HPAD,
        PM_THICKNESS,
        PM_LENGTH,
        color
    );
    // horizontal
    painter.fillRect(
        xpos + PM_VPAD,
        PLUS_START_Y + PM_HPAD + PM_CENTER,
        PM_LENGTH,
        PM_THICKNESS,
        color
    );
}